

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gepard-path.cpp
# Opt level: O3

void __thiscall gepard::Path::~Path(Path *this)

{
  PathData *pPVar1;
  RegionElement *pRVar2;
  
  pPVar1 = this->_pathData;
  if (pPVar1 != (PathData *)0x0) {
    while (pRVar2 = (pPVar1->_region)._first, pRVar2 != (RegionElement *)0x0) {
      (pPVar1->_region)._last = pRVar2;
      (pPVar1->_region)._first = pRVar2->next;
      operator_delete(pRVar2);
    }
    operator_delete(pPVar1);
    return;
  }
  return;
}

Assistant:

Path::~Path()
{
    if (_pathData) {
        delete _pathData;
    }
}